

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int mbedtls_pk_write_pubkey_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  size_t start;
  mbedtls_pk_type_t mVar1;
  mbedtls_ecp_keypair *ec;
  char *local_58;
  char *oid;
  size_t oid_len;
  size_t par_len;
  size_t len;
  uchar *c;
  size_t sStack_28;
  int ret;
  size_t size_local;
  uchar *buf_local;
  mbedtls_pk_context *key_local;
  
  par_len = 0;
  oid_len = 0;
  len = (size_t)(buf + size);
  sStack_28 = size;
  size_local = (size_t)buf;
  buf_local = (uchar *)key;
  c._4_4_ = mbedtls_pk_write_pubkey((uchar **)&len,buf,key);
  key_local._4_4_ = c._4_4_;
  if (-1 < c._4_4_) {
    if ((long)(len - size_local) < 1) {
      key_local._4_4_ = -0x6c;
    }
    else {
      *(undefined1 *)(len - 1) = 0;
      par_len = (long)c._4_4_ + par_len + 1;
      len = len - 1;
      c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,par_len);
      key_local._4_4_ = c._4_4_;
      if (-1 < c._4_4_) {
        par_len = (long)c._4_4_ + par_len;
        c._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'\x03');
        key_local._4_4_ = c._4_4_;
        if (-1 < c._4_4_) {
          par_len = (long)c._4_4_ + par_len;
          mVar1 = mbedtls_pk_get_type((mbedtls_pk_context *)buf_local);
          c._4_4_ = mbedtls_oid_get_oid_by_pk_alg(mVar1,&local_58,(size_t *)&oid);
          key_local._4_4_ = c._4_4_;
          if (c._4_4_ == 0) {
            mVar1 = mbedtls_pk_get_type((mbedtls_pk_context *)buf_local);
            start = size_local;
            if (mVar1 == MBEDTLS_PK_ECKEY) {
              ec = mbedtls_pk_ec(*(mbedtls_pk_context *)buf_local);
              c._4_4_ = pk_write_ec_param((uchar **)&len,(uchar *)start,ec);
              if (c._4_4_ < 0) {
                return c._4_4_;
              }
              oid_len = (long)c._4_4_ + oid_len;
            }
            c._4_4_ = mbedtls_asn1_write_algorithm_identifier
                                ((uchar **)&len,(uchar *)size_local,local_58,(size_t)oid,oid_len);
            key_local._4_4_ = c._4_4_;
            if (-1 < c._4_4_) {
              par_len = (long)c._4_4_ + par_len;
              c._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)size_local,par_len);
              key_local._4_4_ = c._4_4_;
              if (-1 < c._4_4_) {
                par_len = (long)c._4_4_ + par_len;
                key_local._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)size_local,'0');
                if (-1 < key_local._4_4_) {
                  key_local._4_4_ = key_local._4_4_ + (int)par_len;
                }
              }
            }
          }
        }
      }
    }
  }
  return key_local._4_4_;
}

Assistant:

int mbedtls_pk_write_pubkey_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret;
    unsigned char *c;
    size_t len = 0, par_len = 0, oid_len;
    const char *oid;

    c = buf + size;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, key ) );

    if( c - buf < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    /*
     *  SubjectPublicKeyInfo  ::=  SEQUENCE  {
     *       algorithm            AlgorithmIdentifier,
     *       subjectPublicKey     BIT STRING }
     */
    *--c = 0;
    len += 1;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

    if( ( ret = mbedtls_oid_get_oid_by_pk_alg( mbedtls_pk_get_type( key ),
                                       &oid, &oid_len ) ) != 0 )
    {
        return( ret );
    }

#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( key ) == MBEDTLS_PK_ECKEY )
    {
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, mbedtls_pk_ec( *key ) ) );
    }
#endif

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( &c, buf, oid, oid_len,
                                                        par_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}